

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge-swap-reduce.cpp
# Opt level: O1

void redistribute(void *b_,ReduceProxy *srp,RegularSwapPartners *partners)

{
  vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>> *this;
  undefined8 *puVar1;
  BlockID BVar2;
  iterator iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Proxy *pPVar8;
  pointer pPVar9;
  int iVar10;
  pointer pBVar11;
  mapped_type *bb;
  mapped_type *bb_00;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  Point<float,_3U> *pPVar18;
  float fVar19;
  float fVar20;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
  out_points;
  Vector local_b8;
  IncomingQueues *local_98;
  ReduceProxy *local_90;
  ulong local_88;
  RegularSwapPartners *local_80;
  key_type local_78 [2];
  ulong local_68;
  ulong local_58;
  ulong local_48;
  
  uVar12 = srp->round_;
  pBVar11 = (srp->in_link_).neighbors_.
            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_90 = srp;
  local_80 = partners;
  if (0 < (int)((ulong)((long)(srp->in_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar11) >> 3)) {
    local_98 = &(srp->super_Proxy).incoming_;
    lVar17 = 0;
    do {
      BVar2 = pBVar11[lVar17];
      iVar10 = BVar2.gid;
      if ((srp->super_Proxy).gid_ != iVar10) {
        local_b8.super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78[0].gid = iVar10;
        bb = Catch::clara::std::
             map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
             ::operator[](local_98,&local_78[0].gid);
        diy::
        Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>
        ::load(&bb->super_BinaryBuffer,&local_b8);
        local_48 = (ulong)BVar2 & 0xffffffff;
        local_78[0].proc = 0;
        local_78[0].gid = (srp->super_Proxy).gid_;
        local_58 = (ulong)(uint)((int)((ulong)((long)local_b8.
                                                  super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_b8.
                                                  super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                -0x55555555);
        format_str.size_ = 0x25;
        format_str.data_ = "[{}:{}] Received {} points from [{}]\n";
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             local_78;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0x1121;
        local_68 = (ulong)uVar12;
        fmt::v7::vprint(_stderr,format_str,args);
        if (local_b8.
            super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_b8.
            super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar13 = 0;
          uVar16 = 0;
          do {
            pPVar18 = (Point<float,_3U> *)
                      ((long)((local_b8.
                               super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_array<float,_3UL>).
                             _M_elems + lVar13);
            iVar3._M_current = *(Point<float,_3U> **)((long)b_ + 0x108);
            if (iVar3._M_current == *(Point<float,_3U> **)((long)b_ + 0x110)) {
              std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>::
              _M_realloc_insert<diy::Point<float,3u>const&>
                        ((vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>> *)
                         ((long)b_ + 0x100),iVar3,pPVar18);
            }
            else {
              ((iVar3._M_current)->super_array<float,_3UL>)._M_elems[2] =
                   (pPVar18->super_array<float,_3UL>)._M_elems[2];
              *(undefined8 *)((iVar3._M_current)->super_array<float,_3UL>)._M_elems =
                   *(undefined8 *)(pPVar18->super_array<float,_3UL>)._M_elems;
              *(long *)((long)b_ + 0x108) = *(long *)((long)b_ + 0x108) + 0xc;
            }
            uVar16 = uVar16 + 1;
            lVar13 = lVar13 + 0xc;
          } while (uVar16 < (ulong)(((long)local_b8.
                                           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_b8.
                                           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                   -0x5555555555555555));
        }
        srp = local_90;
        if (local_b8.
            super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar17 = lVar17 + 1;
      pBVar11 = (srp->in_link_).neighbors_.
                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar17 < (int)((ulong)((long)(srp->in_link_).neighbors_.
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11
                                   ) >> 3));
  }
  iVar10 = (int)((ulong)((long)(srp->out_link_).neighbors_.
                               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(srp->out_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar10 != 0) {
    Catch::clara::std::
    vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
    ::vector((vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
              *)&local_b8,(long)iVar10,(allocator_type *)local_78);
    local_88 = (ulong)((long)(srp->out_link_).neighbors_.
                             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(srp->out_link_).neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3;
    lVar13 = (long)(local_80->super_RegularPartners).kvs_.
                   super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar12].dim;
    lVar17 = *(long *)((long)b_ + 0x100);
    if (*(long *)((long)b_ + 0x108) != lVar17) {
      fVar19 = (float)(int)local_88;
      local_98 = (IncomingQueues *)(lVar13 * 4);
      lVar14 = 0;
      uVar16 = 0;
      do {
        pPVar18 = (Point<float,_3U> *)(lVar17 + lVar14);
        fVar20 = *(float *)(*(long *)((long)b_ + 0x88) + lVar13 * 4);
        fVar20 = floorf(((*(float *)((long)(pPVar18->super_array<float,_3UL>)._M_elems +
                                    (long)local_98) - fVar20) /
                        (*(float *)(*(long *)((long)b_ + 200) + lVar13 * 4) - fVar20)) * fVar19);
        this = (vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>> *)
               (local_b8.
                super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
                _M_impl.super__Vector_impl_data._M_start +
               ((long)(fVar20 - 9.223372e+18) & (long)fVar20 >> 0x3f | (long)fVar20) * 2);
        iVar3._M_current = *(Point<float,_3U> **)(this + 8);
        if (iVar3._M_current == *(Point<float,_3U> **)(this + 0x10)) {
          std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>::
          _M_realloc_insert<diy::Point<float,3u>const&>(this,iVar3,pPVar18);
        }
        else {
          ((iVar3._M_current)->super_array<float,_3UL>)._M_elems[2] =
               (pPVar18->super_array<float,_3UL>)._M_elems[2];
          *(undefined8 *)((iVar3._M_current)->super_array<float,_3UL>)._M_elems =
               *(undefined8 *)(pPVar18->super_array<float,_3UL>)._M_elems;
          *(long *)(this + 8) = *(long *)(this + 8) + 0xc;
        }
        uVar16 = uVar16 + 1;
        lVar17 = *(long *)((long)b_ + 0x100);
        lVar14 = lVar14 + 0xc;
      } while (uVar16 < (ulong)((*(long *)((long)b_ + 0x108) - lVar17 >> 2) * -0x5555555555555555));
    }
    uVar12 = (uint)local_88;
    local_98 = (IncomingQueues *)lVar13;
    if ((int)uVar12 < 1) {
      iVar10 = -1;
    }
    else {
      pPVar8 = &local_90->super_Proxy;
      uVar15 = 0xffffffff;
      lVar17 = 0;
      uVar16 = 0;
      do {
        pPVar9 = local_b8.
                 super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pBVar11 = (local_90->out_link_).neighbors_.
                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((local_90->super_Proxy).gid_ == pBVar11[uVar16].gid) {
          uVar4 = *(undefined8 *)((long)b_ + 0x110);
          puVar1 = (undefined8 *)
                   ((long)((local_b8.
                            super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_array<float,_3UL>).
                          _M_elems + lVar17);
          uVar5 = puVar1[1];
          uVar6 = *(undefined8 *)((long)b_ + 0x100);
          uVar7 = *(undefined8 *)((long)b_ + 0x108);
          *(undefined8 *)((long)b_ + 0x100) = *puVar1;
          *(undefined8 *)((long)b_ + 0x108) = uVar5;
          *(undefined8 *)((long)b_ + 0x110) =
               *(undefined8 *)
                ((long)local_b8.
                       super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].super_array<float,_3UL>._M_elems
                + lVar17 + 4);
          puVar1 = (undefined8 *)
                   ((long)((local_b8.
                            super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_array<float,_3UL>).
                          _M_elems + lVar17);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          *(undefined8 *)
           ((long)local_b8.
                  super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].super_array<float,_3UL>._M_elems +
           lVar17 + 4) = uVar4;
          uVar15 = uVar16 & 0xffffffff;
        }
        else {
          local_78[0] = pBVar11[uVar16];
          bb_00 = Catch::clara::std::
                  map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                  ::operator[](&pPVar8->outgoing_,local_78);
          diy::
          Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>
          ::save(&bb_00->super_BinaryBuffer,
                 (Vector *)((long)(pPVar9->super_array<float,_3UL>)._M_elems + lVar17));
          local_78[0].proc = 0;
          local_78[0].gid = (local_90->super_Proxy).gid_;
          local_68 = (ulong)(uint)((int)((ulong)(*(long *)((long)((local_b8.
                                                  super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_array<float,_3UL>)._M_elems + lVar17 + 8) -
                                                *(long *)((long)((local_b8.
                                                  super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_array<float,_3UL>)._M_elems + lVar17)) >> 2)
                                  * -0x55555555);
          local_58 = (ulong)(uint)(local_90->out_link_).neighbors_.
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar16].gid;
          format_str_00.size_ = 0x1c;
          format_str_00.data_ = "[{}] Sent {} points to [{}]\n";
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)local_78;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = 0x111;
          fmt::v7::vprint(_stderr,format_str_00,args_00);
        }
        iVar10 = (int)uVar15;
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 0x18;
      } while ((uVar12 & 0x7fffffff) != uVar16);
    }
    lVar17 = *(long *)((long)b_ + 200);
    fVar19 = *(float *)(*(long *)((long)b_ + 0x88) + (long)local_98 * 4);
    fVar20 = (*(float *)(lVar17 + (long)local_98 * 4) - fVar19) / (float)(int)local_88;
    *(float *)(*(long *)((long)b_ + 0x88) + (long)local_98 * 4) = (float)iVar10 * fVar20 + fVar19;
    *(float *)(lVar17 + (long)local_98 * 4) = (float)(iVar10 + 1) * fVar20 + fVar19;
    Catch::clara::std::
    vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
    ::~vector((vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
               *)&local_b8);
  }
  return;
}

Assistant:

void redistribute(void* b_,                                 // local block
                  const diy::ReduceProxy& srp,              // communication proxy
                  const diy::RegularSwapPartners& partners) // partners of the current block
{
    Block*        b        = static_cast<Block*>(b_);
    unsigned      round    = srp.round();                   // current round number

    // step 1: dequeue
    // dequeue all the incoming points and add them to this block's vector
    // could use srp.incoming() instead
    for (int i = 0; i < srp.in_link().size(); ++i)
    {
        int nbr_gid = srp.in_link().target(i).gid;
        if (nbr_gid == srp.gid())
            continue;

        std::vector<Block::Point>    in_points;
        srp.dequeue(nbr_gid, in_points);
        fmt::print(stderr, "[{}:{}] Received {} points from [{}]\n",
                   srp.gid(), round, (int) in_points.size(), nbr_gid);
        for (size_t j = 0; j < in_points.size(); ++j)
            b->points.push_back(in_points[j]);
    }

    // step 2: sort and enqueue
    if (srp.out_link().size() == 0)        // final round; nothing needs to be sent
        return;

    std::vector< std::vector<Block::Point> > out_points(srp.out_link().size());
    int group_size = srp.out_link().size();  // number of outbound partners
    int cur_dim    = partners.dim(round);    // current dimension along which groups are formed
    // sort points into vectors corresponding to neighbor blocks
    for (size_t i = 0; i < b->points.size(); ++i) // for all points
    {
        auto loc = static_cast<size_t>(floor((b->points[i][cur_dim] - b->box.min[cur_dim]) /
                                             (b->box.max[cur_dim] - b->box.min[cur_dim]) * group_size));
        out_points[loc].push_back(b->points[i]);
    }
    int pos = -1;
    // enqueue points to neighbor blocks
    for (int i = 0; i < group_size; ++i)     // for all neighbors
    {
        if (srp.out_link().target(i).gid == srp.gid())
        {
            b->points.swap(out_points[i]);
            pos = i;
        }
        else
        {
            srp.enqueue(srp.out_link().target(i), out_points[i]);
            fmt::print(stderr, "[{}] Sent {} points to [{}]\n",
                       srp.gid(), (int) out_points[i].size(), srp.out_link().target(i).gid);
        }
    }

    // step 3: readjust box boundaries for next round
    float new_min = b->box.min[cur_dim] + (b->box.max[cur_dim] -
                                           b->box.min[cur_dim])/group_size*pos;
    float new_max = b->box.min[cur_dim] + (b->box.max[cur_dim] -
                                           b->box.min[cur_dim])/group_size*(pos + 1);
    b->box.min[cur_dim] = new_min;
    b->box.max[cur_dim] = new_max;
}